

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall asl::Array<asl::String>::free(Array<asl::String> *this,void *__ptr)

{
  int iVar1;
  String *pSVar2;
  long lVar3;
  
  pSVar2 = this->_a;
  iVar1 = *(int *)&pSVar2[-1].field_2;
  if ((long)iVar1 != 0) {
    lVar3 = 0;
    do {
      if (*(int *)((long)&pSVar2->_size + lVar3) != 0) {
        ::free(*(void **)((long)&pSVar2->field_2 + lVar3));
      }
      lVar3 = lVar3 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar3);
  }
  ::free(&this->_a[-1].field_2);
  this->_a = (String *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}